

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Control_PDU.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::PDU::Intercom_Control_PDU::operator==(Intercom_Control_PDU *this,Intercom_Control_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Intercom_Control_PDU *Value_local;
  Intercom_Control_PDU *this_local;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if ((this->super_Header).super_Header6.field_0x27 ==
           (Value->super_Header).super_Header6.field_0x27) {
    KVar1 = DATA_TYPE::CommunicationsChannelType::operator!=
                      (&this->m_CommChannelType,&Value->m_CommChannelType);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_SrcEnt,&Value->m_SrcEnt);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else if (this->m_ui16SrcCommDevID == Value->m_ui16SrcCommDevID) {
        if (this->m_ui8SrcLineID == Value->m_ui8SrcLineID) {
          if (this->m_ui8TransmitPriority == Value->m_ui8TransmitPriority) {
            if (this->m_ui8TransmitLineState == Value->m_ui8TransmitLineState) {
              if (this->m_ui8Command == Value->m_ui8Command) {
                KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                                  (&this->m_MstrEntID,&Value->m_MstrEntID);
                if (KVar1) {
                  this_local._7_1_ = false;
                }
                else if (this->m_ui16MstrCommDeviceID == Value->m_ui16MstrCommDeviceID) {
                  if (this->m_ui16MstrChannelID == Value->m_ui16MstrChannelID) {
                    if (this->m_ui32IntrParamLen == Value->m_ui32IntrParamLen) {
                      bVar2 = std::operator!=(&this->m_vICP,&Value->m_vICP);
                      if (bVar2) {
                        this_local._7_1_ = false;
                      }
                      else {
                        this_local._7_1_ = true;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Intercom_Control_PDU::operator == ( const Intercom_Control_PDU & Value ) const
{
    if( Header::operator       !=( Value ) )                     return false;
    if( m_ui8CtrlTyp           != Value.m_ui8CtrlTyp )           return false;
    if( m_CommChannelType      != Value.m_CommChannelType )      return false;
    if( m_SrcEnt               != Value.m_SrcEnt )               return false;
    if( m_ui16SrcCommDevID     != Value.m_ui16SrcCommDevID )     return false;
    if( m_ui8SrcLineID         != Value.m_ui8SrcLineID )         return false;
    if( m_ui8TransmitPriority  != Value.m_ui8TransmitPriority )  return false;
    if( m_ui8TransmitLineState != Value.m_ui8TransmitLineState ) return false;
    if( m_ui8Command           != Value.m_ui8Command )           return false;
    if( m_MstrEntID            != Value.m_MstrEntID )            return false;
    if( m_ui16MstrCommDeviceID != Value.m_ui16MstrCommDeviceID ) return false;
    if( m_ui16MstrChannelID    != Value.m_ui16MstrChannelID )    return false;
    if( m_ui32IntrParamLen     != Value.m_ui32IntrParamLen )     return false;
    if( m_vICP                 != Value.m_vICP )                 return false;
    return true;
}